

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int __thiscall CVmUTF8Source::seek(CVmUTF8Source *this,long ofs,int mode)

{
  size_t sVar1;
  size_t charcnt;
  
  if (mode != 0) {
    if (mode == 2) {
      ofs = ofs + this->charlen;
    }
    else {
      if (mode != 1) {
        return 1;
      }
      ofs = ofs + this->charidx;
    }
  }
  sVar1 = this->charlen;
  if (ofs < (long)this->charlen) {
    sVar1 = ofs;
  }
  charcnt = 0;
  if (-1 < ofs) {
    charcnt = sVar1;
  }
  this->charidx = charcnt;
  sVar1 = utf8_ptr::s_bytelen(this->str,charcnt);
  this->byteidx = sVar1;
  return 0;
}

Assistant:

virtual int seek(long ofs, int mode)
    {
        /* figure the absolute position based on the mode */
        switch (mode)
        {
        case OSFSK_SET:
            /* set - the offset is already absolute */
            break;

        case OSFSK_CUR:
            /* relative to current index */
            ofs += charidx;
            break;

        case OSFSK_END:
            /* relative to the end of file */
            ofs += charlen;
            break;
            
        default:
            /* invalid mode - return an error */
            return 1;
        }

        /* limit the position to the bounds of the string */
        if (ofs < 0)
            ofs = 0;
        else if (ofs > (long)charlen)
            ofs = (long)charlen;

        /* 
         *   The caller is working with the stream: the byte index in the
         *   stream equals the character index in the string.
         */
        charidx = (size_t)ofs;

        /* calculate the byte index for the new character index */
        utf8_ptr p((char *)str);
        byteidx = p.bytelen(charidx);

        /* success */
        return 0;
    }